

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational_tests.cc
# Opt level: O0

void __thiscall RationalTest_SimpleSubtract_Test::TestBody(RationalTest_SimpleSubtract_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  Message local_b8 [3];
  int local_9c;
  long local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  rational_comparison_t comparison;
  rational_t result;
  rational_t expected;
  rational_t r2;
  rational_t r1;
  RationalTest_SimpleSubtract_Test *this_local;
  
  rational_init((rational_t *)&r2.valid,2,3);
  rational_init((rational_t *)&expected.valid,-1,6);
  rational_init((rational_t *)&result.valid,5,6);
  rational_subtract((rational_t *)&r2.valid,(rational_t *)&expected.valid,
                    (rational_t *)&comparison.valid);
  local_98 = rational_compare((rational_t *)&comparison.valid,(rational_t *)&result.valid,
                              (rational_comparison_t *)&gtest_ar.message_);
  local_9c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_90,"rational_compare(&result, &expected, &comparison)","0",&local_98,
             &local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/rational_adt/rational_tests.cc"
               ,0x70,message);
    testing::internal::AssertHelper::operator=(&local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(RationalTest, SimpleSubtract)
{
    rational_t r1, r2, expected, result;
    rational_comparison_t comparison;

    rational_init(&r1, 2, 3);
    rational_init(&r2, -1, 6);
    rational_init(&expected, 5, 6);

    rational_subtract(&r1, &r2, &result);

    ASSERT_EQ(rational_compare(&result, &expected, &comparison), 0);
}